

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::HttpHeaders::Request> * __thiscall
kj::HttpHeaders::tryParseRequest
          (Maybe<kj::HttpHeaders::Request> *__return_storage_ptr__,HttpHeaders *this,
          ArrayPtr<char> content)

{
  bool bVar1;
  char *end;
  ArrayPtr<char> content_00;
  char *ptr;
  kj *local_58;
  size_t local_50;
  Maybe<kj::StringPtr> local_48;
  
  content_00.size_ = (kj *)content.ptr;
  content_00.ptr = (char *)content.size_;
  end = trimHeaderEnding(content_00.size_,content_00);
  if (((end != (char *)0x0) &&
      (local_58 = content_00.size_, consumeHttpMethod((kj *)&local_48,(char **)&local_58),
      (kj)local_48.ptr.isSet == (kj)0x1)) && ((*local_58 == (kj)0x20 || (*local_58 == (kj)0x9)))) {
    local_58 = local_58 + 1;
    consumeWord(&local_48,(char **)&local_58);
    if ((kj)local_48.ptr.isSet == (kj)0x1) {
      local_50 = local_48.ptr.field_1.value.content.size_;
      consumeLine((char **)&local_58);
      bVar1 = parseHeaders(this,(char *)local_58,end);
      if (bVar1) {
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.method = local_48.ptr._4_4_;
        (__return_storage_ptr__->ptr).field_1.value.url.content.ptr =
             local_48.ptr.field_1.value.content.ptr;
        (__return_storage_ptr__->ptr).field_1.value.url.content.size_ = local_50;
        return __return_storage_ptr__;
      }
    }
  }
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<HttpHeaders::Request> HttpHeaders::tryParseRequest(kj::ArrayPtr<char> content) {
  char* end = trimHeaderEnding(content);
  if (end == nullptr) return nullptr;

  char* ptr = content.begin();

  HttpHeaders::Request request;

  KJ_IF_MAYBE(method, consumeHttpMethod(ptr)) {
    request.method = *method;
    if (*ptr != ' ' && *ptr != '\t') {
      return nullptr;
    }
    ++ptr;
  } else {
    return nullptr;
  }

  KJ_IF_MAYBE(path, consumeWord(ptr)) {
    request.url = *path;
  } else {
    return nullptr;
  }

  // Ignore rest of line. Don't care about "HTTP/1.1" or whatever.
  consumeLine(ptr);

  if (!parseHeaders(ptr, end)) return nullptr;

  return request;
}